

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void spell_fortify_weapon(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  OBJ_APPLY_DATA *pOVar6;
  int iVar7;
  char *pcVar8;
  OBJ_APPLY_DATA *pOVar9;
  char *local_38;
  
  if (*(short *)((long)vo + 0x98) != 5) {
    pcVar8 = "You can only cast this on weapons.\n\r";
LAB_00313fc7:
    send_to_char(pcVar8,ch);
    return;
  }
  bVar2 = is_metal((OBJ_DATA *)vo);
  if (!bVar2) {
    pcVar8 = "You can only fortify metallic weapons.\n\r";
    goto LAB_00313fc7;
  }
  bVar2 = is_worn((OBJ_DATA *)vo);
  if (bVar2) {
    pcVar8 = "You must remove it to enchant it.\n\r";
    goto LAB_00313fc7;
  }
  iVar4 = ~*(uint *)((long)vo + 0x124) * *(int *)((long)vo + 0x120) + level;
  sVar3 = *(short *)(*(long *)((long)vo + 0x50) + 0xce);
  iVar5 = iVar4 * 4 + 0x32;
  if (sVar3 == 0) {
    iVar5 = iVar4 * 4 + 0x46;
  }
  iVar4 = iVar5 + -0x32;
  if (1 < (ushort)(sVar3 - 1U)) {
    iVar4 = iVar5;
  }
  if ((ushort)(sVar3 - 3U) < 0x12) {
    iVar4 = iVar5 - (int)((double)(int)sVar3 * -2.5 + 50.0);
  }
  iVar5 = number_percent();
  iVar4 = iVar4 - iVar5;
  if (iVar4 < 0x33) {
    if (iVar4 < 1) {
      if (-0x19 < iVar4) {
        act("Your magic fails to take hold on $p.",ch,vo,(void *)0x0,3);
        pcVar8 = "$p hums very briefly in $n\'s hands.";
        goto LAB_003143d7;
      }
      act("$p shudders and explodes in your hands!",ch,vo,(void *)0x0,3);
      act("$p shudders and explodes in $n\'s hands!",ch,vo,(void *)0x0,0);
      iVar5 = dice((int)*(short *)((long)vo + 0x108),5);
      goto LAB_0031418b;
    }
    iVar5 = number_percent();
    if (0x32 < iVar5) {
      pOVar6 = *(OBJ_APPLY_DATA **)((long)vo + 0x38);
      iVar5 = 0;
      pOVar9 = (OBJ_APPLY_DATA *)0x0;
      bVar2 = false;
      goto LAB_003141c5;
    }
  }
  pOVar6 = *(OBJ_APPLY_DATA **)((long)vo + 0x38);
  for (pOVar9 = pOVar6; pOVar9 != (OBJ_APPLY_DATA *)0x0; pOVar9 = pOVar9->next) {
    if ((pOVar9->location == 0x12) && (pOVar9->type == sn)) {
      iVar5 = (int)pOVar9->modifier;
      bVar2 = true;
      if (0x32 < iVar4) goto LAB_003141c5;
      goto LAB_0031412d;
    }
  }
  pOVar6 = new_apply_data();
  pOVar6->type = (short)sn;
  pOVar6->location = 0x12;
  pOVar6->modifier = 0;
  pOVar6->next = *(OBJ_APPLY_DATA **)((long)vo + 0x38);
  *(OBJ_APPLY_DATA **)((long)vo + 0x38) = pOVar6;
  pOVar9 = pOVar6;
  if (iVar4 < 0x33) {
    iVar5 = 0;
LAB_0031412d:
    bVar2 = true;
    bVar1 = false;
    pOVar6 = (OBJ_APPLY_DATA *)0x0;
    iVar4 = 0;
  }
  else {
    iVar5 = 0;
    bVar2 = true;
    do {
      if ((pOVar6->location == 0x13) && (pOVar6->type == sn)) {
        iVar4 = (int)pOVar6->modifier;
        goto LAB_0031421c;
      }
      pOVar6 = pOVar6->next;
LAB_003141c5:
    } while (pOVar6 != (OBJ_APPLY_DATA *)0x0);
    pOVar6 = new_apply_data();
    pOVar6->type = (short)sn;
    pOVar6->location = 0x13;
    pOVar6->modifier = 0;
    pOVar6->next = *(OBJ_APPLY_DATA **)((long)vo + 0x38);
    *(OBJ_APPLY_DATA **)((long)vo + 0x38) = pOVar6;
    iVar4 = 0;
LAB_0031421c:
    bVar1 = true;
  }
  iVar7 = 0x50;
  if (!bVar2) {
    iVar7 = 0x32;
  }
  if (!bVar1) {
    iVar7 = 0x32;
  }
  iVar7 = (iVar7 - (int)((double)(iVar4 + iVar5) * 7.5)) +
          (level - *(int *)((long)vo + 0x120) * *(int *)((long)vo + 0x124)) * 4;
  if (10 < iVar5) {
    iVar7 = 2;
  }
  if (10 < iVar4) {
    iVar7 = 2;
  }
  if (bVar2) {
    iVar5 = number_percent();
    if (iVar5 < iVar7) {
      local_38 = "$p rings with a light piercing tone as $n\'s magic works upon it.";
      pcVar8 = "You feel $p\'s balance improve in your hands as it is infused with magic.";
      sVar3 = 1;
LAB_003142c1:
      pOVar9->modifier = pOVar9->modifier + sVar3;
      act(pcVar8,ch,vo,(void *)0x0,3);
      act(local_38,ch,vo,(void *)0x0,0);
      goto LAB_003142f3;
    }
    iVar5 = number_percent();
    if (iVar5 <= iVar7) {
      local_38 = "$p emits a discordant tone as $n\'s magic works upon it.";
      pcVar8 = "You feel $p twist in your hands as the magic goes awry.";
      sVar3 = -1;
      goto LAB_003142c1;
    }
  }
  else {
LAB_003142f3:
    if (!bVar1) {
      return;
    }
    iVar5 = number_percent();
    if (iVar5 < iVar7) {
      pOVar6->modifier = pOVar6->modifier + 1;
      act("You feel $p grow sturdier in your hands as it is infused with magic.",ch,vo,(void *)0x0,3
         );
      pcVar8 = "$p flickers with a cerulean glow as $n\'s magic works upon it.";
LAB_003143d7:
      act(pcVar8,ch,vo,(void *)0x0,0);
      return;
    }
    iVar5 = number_percent();
    if (iVar5 <= iVar7) {
      pOVar6->modifier = pOVar6->modifier + -1;
      act("You feel $p grow frail in your hands as the magic goes awry.",ch,vo,(void *)0x0,3);
      pcVar8 = "$p flickers with a crimson glow as $n\'s magic works upon it.";
      goto LAB_003143d7;
    }
  }
  act("$p shudders and explodes in your hands!",ch,vo,(void *)0x0,3);
  act("$p shudders and explodes in $n\'s hands!",ch,vo,(void *)0x0,0);
  iVar5 = dice((int)*(short *)((long)vo + 0x108),5);
LAB_0031418b:
  damage_new(ch,ch,iVar5,-1,0xb,true,false,0,1,"the explosion*");
  extract_obj((OBJ_DATA *)vo);
  return;
}

Assistant:

void spell_fortify_weapon(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *weapon = (OBJ_DATA *)vo;
	OBJ_APPLY_DATA *hitapp = nullptr, *damapp = nullptr;
	bool damfound = false, hitfound = false;
	bool dambonus = false, hitbonus = false;
	int chance = 50, diff, oldhit = 0, olddam = 0;

	if (weapon->item_type != ITEM_WEAPON)
	{
		send_to_char("You can only cast this on weapons.\n\r", ch);
		return;
	}

	if (!is_metal(weapon))
	{
		send_to_char("You can only fortify metallic weapons.\n\r", ch);
		return;
	}

	if (is_worn(weapon))
	{
		send_to_char("You must remove it to enchant it.\n\r", ch);
		return;
	}

	chance += (4 * (level - ((1 + weapon->value[2]) * weapon->value[1])));

	if (weapon->pIndexData->limtotal == 0)
		chance += 20;

	if (weapon->pIndexData->limtotal == 1 || weapon->pIndexData->limtotal == 2)
		chance -= 50;

	if (weapon->pIndexData->limtotal >= 3 && weapon->pIndexData->limtotal <= 20)
		chance -= (int)(50 - (2.5 * (float)weapon->pIndexData->limtotal));

	diff = chance - number_percent();

	if (diff > 50)
	{
		hitbonus = true;
		dambonus = true;
	}
	else if (diff > 0)
	{
		if (number_percent() > 50)
			dambonus = true;
		else
			hitbonus = true;
	}
	else if (diff > -25)
	{
		act("Your magic fails to take hold on $p.", ch, weapon, 0, TO_CHAR);
		act("$p hums very briefly in $n's hands.", ch, weapon, 0, TO_ROOM);
		return;
	}
	else
	{
		act("$p shudders and explodes in your hands!", ch, weapon, 0, TO_CHAR);
		act("$p shudders and explodes in $n's hands!", ch, weapon, 0, TO_ROOM);
		damage_new(ch, ch, dice(weapon->level, 5), TYPE_UNDEFINED, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the explosion*");
		extract_obj(weapon);
		return;
	}

	if (hitbonus)
	{
		for (hitapp = weapon->apply; hitapp; hitapp = hitapp->next)
		{
			if (hitapp->location == APPLY_HITROLL && hitapp->type == sn)
			{
				hitfound = true;
				oldhit = hitapp->modifier;
				break;
			}
		}

		if (!hitfound)
		{
			hitapp = new_apply_data();
			hitapp->type = sn;
			hitapp->location = APPLY_HITROLL;
			hitapp->modifier = 0;
			hitapp->next = weapon->apply;
			weapon->apply = hitapp;
		}
	}

	if (dambonus)
	{
		for (damapp = weapon->apply; damapp; damapp = damapp->next)
		{
			if (damapp->location == APPLY_DAMROLL && damapp->type == sn)
			{
				damfound = true;
				olddam = damapp->modifier;
				break;
			}
		}

		if (!damfound)
		{
			damapp = new_apply_data();
			damapp->type = sn;
			damapp->location = APPLY_DAMROLL;
			damapp->modifier = 0;
			damapp->next = weapon->apply;
			weapon->apply = damapp;
		}
	}

	chance = 50;
	chance -= (int)(7.5 * (olddam + oldhit));
	chance += 4 * (level - ((weapon->value[2]) * weapon->value[1]));

	if (hitbonus && dambonus)
		chance += 30;

	if (olddam > 10 || oldhit > 10)
		chance = 2;

	if (hitbonus)
	{
		if (number_percent() < chance)
		{
			hitapp->modifier += 1;
			act("You feel $p's balance improve in your hands as it is infused with magic.", ch, weapon, 0, TO_CHAR);
			act("$p rings with a light piercing tone as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
		}
		else
		{
			if (number_percent() > chance)
			{
				act("$p shudders and explodes in your hands!", ch, weapon, 0, TO_CHAR);
				act("$p shudders and explodes in $n's hands!", ch, weapon, 0, TO_ROOM);
				damage_new(ch, ch, dice(weapon->level, 5), TYPE_UNDEFINED, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the explosion*");
				extract_obj(weapon);
				return;
			}
			else
			{
				hitapp->modifier -= 1;
				act("You feel $p twist in your hands as the magic goes awry.", ch, weapon, 0, TO_CHAR);
				act("$p emits a discordant tone as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
			}
		}
	}

	if (dambonus)
	{
		if (number_percent() < chance)
		{
			damapp->modifier += 1;
			act("You feel $p grow sturdier in your hands as it is infused with magic.", ch, weapon, 0, TO_CHAR);
			act("$p flickers with a cerulean glow as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
		}
		else
		{
			if (number_percent() > chance)
			{
				act("$p shudders and explodes in your hands!", ch, weapon, 0, TO_CHAR);
				act("$p shudders and explodes in $n's hands!", ch, weapon, 0, TO_ROOM);
				damage_new(ch, ch, dice(weapon->level, 5), TYPE_UNDEFINED, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the explosion*");
				extract_obj(weapon);
				return;
			}
			else
			{
				damapp->modifier -= 1;
				act("You feel $p grow frail in your hands as the magic goes awry.", ch, weapon, 0, TO_CHAR);
				act("$p flickers with a crimson glow as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
			}
		}
	}
}